

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac_meth.c
# Opt level: O0

void * evp_mac_from_algorithm(int name_id,OSSL_ALGORITHM *algodef,OSSL_PROVIDER *prov)

{
  char *pcVar1;
  OSSL_FUNC_mac_init_fn *pOVar2;
  undefined1 *puVar3;
  long in_RDX;
  long in_RSI;
  undefined4 in_EDI;
  int fnctxcnt;
  int fnmaccnt;
  EVP_MAC *mac;
  OSSL_DISPATCH *fns;
  OSSL_PROVIDER *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  int iVar4;
  int line;
  OSSL_DISPATCH *local_28;
  long *local_8;
  
  local_28 = *(OSSL_DISPATCH **)(in_RSI + 0x10);
  line = 0;
  iVar4 = 0;
  local_8 = (long *)evp_mac_new();
  if (local_8 == (long *)0x0) {
    ERR_new();
    ERR_set_debug((char *)local_8,line,in_stack_ffffffffffffffc0);
    ERR_set_error(6,0xc0100,(char *)0x0);
    local_8 = (long *)0x0;
  }
  else {
    *(undefined4 *)(local_8 + 1) = in_EDI;
    pcVar1 = ossl_algorithm_get1_first_name((OSSL_ALGORITHM *)CONCAT44(line,iVar4));
    local_8[2] = (long)pcVar1;
    if (pcVar1 == (char *)0x0) {
      evp_mac_free(in_stack_ffffffffffffffc0);
      local_8 = (long *)0x0;
    }
    else {
      local_8[3] = *(long *)(in_RSI + 0x18);
      for (; local_28->function_id != 0; local_28 = local_28 + 1) {
        in_stack_ffffffffffffffc0 = (char *)(ulong)(local_28->function_id - 1);
        switch(in_stack_ffffffffffffffc0) {
        case (char *)0x0:
          if (local_8[6] == 0) {
            puVar3 = OSSL_FUNC_mac_newctx(local_28);
            local_8[6] = (long)puVar3;
            iVar4 = iVar4 + 1;
          }
          break;
        case (char *)0x1:
          if (local_8[7] == 0) {
            puVar3 = OSSL_FUNC_mac_dupctx(local_28);
            local_8[7] = (long)puVar3;
          }
          break;
        case (char *)0x2:
          if (local_8[8] == 0) {
            puVar3 = OSSL_FUNC_mac_freectx(local_28);
            local_8[8] = (long)puVar3;
            iVar4 = iVar4 + 1;
          }
          break;
        case (char *)0x3:
          if (local_8[9] == 0) {
            pOVar2 = OSSL_FUNC_mac_init(local_28);
            local_8[9] = (long)pOVar2;
            line = line + 1;
          }
          break;
        case (char *)0x4:
          if (local_8[10] == 0) {
            puVar3 = OSSL_FUNC_mac_update(local_28);
            local_8[10] = (long)puVar3;
            line = line + 1;
          }
          break;
        case (char *)0x5:
          if (local_8[0xb] == 0) {
            puVar3 = OSSL_FUNC_mac_final(local_28);
            local_8[0xb] = (long)puVar3;
            line = line + 1;
          }
          break;
        case (char *)0x6:
          if (local_8[0xf] == 0) {
            puVar3 = OSSL_FUNC_mac_get_params(local_28);
            local_8[0xf] = (long)puVar3;
          }
          break;
        case (char *)0x7:
          if (local_8[0x10] == 0) {
            puVar3 = OSSL_FUNC_mac_get_ctx_params(local_28);
            local_8[0x10] = (long)puVar3;
          }
          break;
        case (char *)0x8:
          if (local_8[0x11] == 0) {
            puVar3 = OSSL_FUNC_mac_set_ctx_params(local_28);
            local_8[0x11] = (long)puVar3;
          }
          break;
        case (char *)0x9:
          if (local_8[0xc] == 0) {
            puVar3 = OSSL_FUNC_mac_gettable_params(local_28);
            local_8[0xc] = (long)puVar3;
          }
          break;
        case (char *)0xa:
          if (local_8[0xd] == 0) {
            puVar3 = OSSL_FUNC_mac_gettable_ctx_params(local_28);
            local_8[0xd] = (long)puVar3;
          }
          break;
        case (char *)0xb:
          if (local_8[0xe] == 0) {
            puVar3 = OSSL_FUNC_mac_settable_ctx_params(local_28);
            local_8[0xe] = (long)puVar3;
          }
        }
      }
      if ((line == 3) && (iVar4 == 2)) {
        *local_8 = in_RDX;
        if (in_RDX != 0) {
          ossl_provider_up_ref(in_stack_ffffffffffffffb8);
        }
      }
      else {
        evp_mac_free(in_stack_ffffffffffffffc0);
        ERR_new();
        ERR_set_debug((char *)local_8,line,in_stack_ffffffffffffffc0);
        ERR_set_error(6,0xc1,(char *)0x0);
        local_8 = (long *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

static void *evp_mac_from_algorithm(int name_id,
                                    const OSSL_ALGORITHM *algodef,
                                    OSSL_PROVIDER *prov)
{
    const OSSL_DISPATCH *fns = algodef->implementation;
    EVP_MAC *mac = NULL;
    int fnmaccnt = 0, fnctxcnt = 0;

    if ((mac = evp_mac_new()) == NULL) {
        ERR_raise(ERR_LIB_EVP, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    mac->name_id = name_id;
    if ((mac->type_name = ossl_algorithm_get1_first_name(algodef)) == NULL) {
        evp_mac_free(mac);
        return NULL;
    }
    mac->description = algodef->algorithm_description;

    for (; fns->function_id != 0; fns++) {
        switch (fns->function_id) {
        case OSSL_FUNC_MAC_NEWCTX:
            if (mac->newctx != NULL)
                break;
            mac->newctx = OSSL_FUNC_mac_newctx(fns);
            fnctxcnt++;
            break;
        case OSSL_FUNC_MAC_DUPCTX:
            if (mac->dupctx != NULL)
                break;
            mac->dupctx = OSSL_FUNC_mac_dupctx(fns);
            break;
        case OSSL_FUNC_MAC_FREECTX:
            if (mac->freectx != NULL)
                break;
            mac->freectx = OSSL_FUNC_mac_freectx(fns);
            fnctxcnt++;
            break;
        case OSSL_FUNC_MAC_INIT:
            if (mac->init != NULL)
                break;
            mac->init = OSSL_FUNC_mac_init(fns);
            fnmaccnt++;
            break;
        case OSSL_FUNC_MAC_UPDATE:
            if (mac->update != NULL)
                break;
            mac->update = OSSL_FUNC_mac_update(fns);
            fnmaccnt++;
            break;
        case OSSL_FUNC_MAC_FINAL:
            if (mac->final != NULL)
                break;
            mac->final = OSSL_FUNC_mac_final(fns);
            fnmaccnt++;
            break;
        case OSSL_FUNC_MAC_GETTABLE_PARAMS:
            if (mac->gettable_params != NULL)
                break;
            mac->gettable_params =
                OSSL_FUNC_mac_gettable_params(fns);
            break;
        case OSSL_FUNC_MAC_GETTABLE_CTX_PARAMS:
            if (mac->gettable_ctx_params != NULL)
                break;
            mac->gettable_ctx_params =
                OSSL_FUNC_mac_gettable_ctx_params(fns);
            break;
        case OSSL_FUNC_MAC_SETTABLE_CTX_PARAMS:
            if (mac->settable_ctx_params != NULL)
                break;
            mac->settable_ctx_params =
                OSSL_FUNC_mac_settable_ctx_params(fns);
            break;
        case OSSL_FUNC_MAC_GET_PARAMS:
            if (mac->get_params != NULL)
                break;
            mac->get_params = OSSL_FUNC_mac_get_params(fns);
            break;
        case OSSL_FUNC_MAC_GET_CTX_PARAMS:
            if (mac->get_ctx_params != NULL)
                break;
            mac->get_ctx_params = OSSL_FUNC_mac_get_ctx_params(fns);
            break;
        case OSSL_FUNC_MAC_SET_CTX_PARAMS:
            if (mac->set_ctx_params != NULL)
                break;
            mac->set_ctx_params = OSSL_FUNC_mac_set_ctx_params(fns);
            break;
        }
    }
    if (fnmaccnt != 3
        || fnctxcnt != 2) {
        /*
         * In order to be a consistent set of functions we must have at least
         * a complete set of "mac" functions, and a complete set of context
         * management functions, as well as the size function.
         */
        evp_mac_free(mac);
        ERR_raise(ERR_LIB_EVP, EVP_R_INVALID_PROVIDER_FUNCTIONS);
        return NULL;
    }
    mac->prov = prov;
    if (prov != NULL)
        ossl_provider_up_ref(prov);

    return mac;
}